

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestCamelCaseFieldNames::_InternalSerialize
          (TestCamelCaseFieldNames *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  ForeignMessage *value;
  size_t sVar2;
  bool bVar3;
  anon_union_176_1_493b367e_for_TestCamelCaseFieldNames_3 aVar4;
  int iVar5;
  const_reference piVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *value_00;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  char *in_R9;
  int iVar12;
  byte *pbVar13;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  string_view field_name_04;
  
  aVar4 = this->field_0;
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x10) != (undefined1  [176])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.primitivefield_,target);
  }
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x1) != (undefined1  [176])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.stringfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestCamelCaseFieldNames.StringField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x33,field_name);
    s._M_str = (char *)*puVar11;
    s._M_len = puVar11[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x20) != (undefined1  [176])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = (ulong)(this->field_0)._impl_.enumfield_;
    pbVar13 = target + 1;
    *target = 0x18;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar13 = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        pbVar13 = pbVar13 + 1;
        bVar3 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar3);
    }
    *pbVar13 = (byte)uVar9;
    target = pbVar13 + 1;
  }
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x8) != (undefined1  [176])0x0) {
    value = (this->field_0)._impl_.messagefield_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x2) != (undefined1  [176])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.stringpiecefield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
              );
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"proto2_unittest.TestCamelCaseFieldNames.StringPieceField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x38,field_name_00
              );
    s_00._M_str = (char *)*puVar11;
    s_00._M_len = puVar11[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,5,s_00,target);
  }
  if (((undefined1  [176])aVar4 & (undefined1  [176])0x4) != (undefined1  [176])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.cordfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"proto2_unittest.TestCamelCaseFieldNames.CordField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x31,field_name_01
              );
    s_01._M_str = (char *)*puVar11;
    s_01._M_len = puVar11[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,6,s_01,target);
  }
  pRVar1 = &(this->field_0)._impl_.repeatedprimitivefield_;
  iVar5 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [176])((undefined1  [176])this->field_0 & (undefined1  [176])0x4)
                     == (undefined1  [176])0x0);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar12);
      uVar9 = (ulong)*piVar6;
      pbVar13 = target + 1;
      *target = 0x38;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar13 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar13 = pbVar13 + 1;
          bVar3 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar3);
      }
      *pbVar13 = (byte)uVar9;
      target = pbVar13 + 1;
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar5);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x20);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase,
                          iVar12);
      field_name_02._M_str = in_R9;
      field_name_02._M_len = (size_t)"proto2_unittest.TestCamelCaseFieldNames.RepeatedStringField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x3b,field_name_02);
      sVar2 = pVVar7->_M_string_length;
      if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x42;
        target[1] = (byte)sVar2;
        memcpy(target + 2,(pVVar7->_M_dataplus)._M_p,sVar2);
        target = target + sVar2 + 2;
      }
      else {
        s_02._M_str = (pVVar7->_M_dataplus)._M_p;
        s_02._M_len = sVar2;
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,8,s_02,target)
        ;
      }
      iVar12 = iVar12 + 1;
    } while (iVar5 != iVar12);
  }
  pRVar1 = &(this->field_0)._impl_.repeatedenumfield_;
  iVar5 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar12);
      uVar9 = (ulong)*piVar6;
      pbVar13 = target + 1;
      *target = 0x48;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar13 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar13 = pbVar13 + 1;
          bVar3 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar3);
      }
      *pbVar13 = (byte)uVar9;
      target = pbVar13 + 1;
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar5);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x48);
  if (iVar5 != 0) {
    iVar12 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                           (&(this->field_0)._impl_.repeatedmessagefield_.super_RepeatedPtrFieldBase
                            ,iVar12);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar12 = iVar12 + 1;
    } while (iVar5 != iVar12);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x60);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedstringpiecefield_.
                           super_RepeatedPtrFieldBase,iVar12);
      field_name_03._M_str = in_R9;
      field_name_03._M_len =
           (size_t)"proto2_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x40,field_name_03);
      sVar2 = pVVar7->_M_string_length;
      if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x5a;
        target[1] = (byte)sVar2;
        memcpy(target + 2,(pVVar7->_M_dataplus)._M_p,sVar2);
        target = target + sVar2 + 2;
      }
      else {
        s_03._M_str = (pVVar7->_M_dataplus)._M_p;
        s_03._M_len = sVar2;
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xb,s_03,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar5 != iVar12);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x78);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase,
                          iVar12);
      field_name_04._M_str = in_R9;
      field_name_04._M_len = (size_t)"proto2_unittest.TestCamelCaseFieldNames.RepeatedCordField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x39,field_name_04);
      sVar2 = pVVar7->_M_string_length;
      if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x62;
        target[1] = (byte)sVar2;
        memcpy(target + 2,(pVVar7->_M_dataplus)._M_p,sVar2);
        target = target + sVar2 + 2;
      }
      else {
        s_04._M_str = (pVVar7->_M_dataplus)._M_p;
        s_04._M_len = sVar2;
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xc,s_04,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar5 != iVar12);
  }
  uVar10 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    puVar8 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar10 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar8;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestCamelCaseFieldNames::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestCamelCaseFieldNames)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 PrimitiveField = 1;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_primitivefield(), target);
  }

  // string StringField = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_stringfield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.StringField");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .proto2_unittest.ForeignEnum EnumField = 3;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_enumfield(), target);
  }

  // .proto2_unittest.ForeignMessage MessageField = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.messagefield_, this_._impl_.messagefield_->GetCachedSize(), target,
        stream);
  }

  // string StringPieceField = 5 [ctype = STRING_PIECE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_stringpiecefield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.StringPieceField");
    target = stream->WriteStringMaybeAliased(5, _s, target);
  }

  // string CordField = 6 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_cordfield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.CordField");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // repeated int32 RepeatedPrimitiveField = 7;
  for (int i = 0, n = this_._internal_repeatedprimitivefield_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        7, this_._internal_repeatedprimitivefield().Get(i), target);
  }

  // repeated string RepeatedStringField = 8;
  for (int i = 0, n = this_._internal_repeatedstringfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringfield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    target = stream->WriteString(8, s, target);
  }

  // repeated .proto2_unittest.ForeignEnum RepeatedEnumField = 9;
  for (int i = 0, n = this_._internal_repeatedenumfield_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        9, static_cast<::proto2_unittest::ForeignEnum>(this_._internal_repeatedenumfield().Get(i)),
        target);
  }

  // repeated .proto2_unittest.ForeignMessage RepeatedMessageField = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedmessagefield_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeatedmessagefield().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
  for (int i = 0, n = this_._internal_repeatedstringpiecefield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringpiecefield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    target = stream->WriteString(11, s, target);
  }

  // repeated string RepeatedCordField = 12 [ctype = CORD];
  for (int i = 0, n = this_._internal_repeatedcordfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedcordfield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    target = stream->WriteString(12, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestCamelCaseFieldNames)
  return target;
}